

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O3

PaError BuildDeviceList(PaAlsaHostApiRepresentation *alsaApi)

{
  ulong uVar1;
  PaAlsaHostApiRepresentation *pPVar2;
  PaUtilAllocationGroup *pPVar3;
  char *__s2;
  undefined8 uVar4;
  byte *pbVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  char *pcVar9;
  size_t sVar10;
  char *pcVar11;
  byte *pbVar12;
  snd_ctl_t *psVar13;
  long lVar14;
  long lVar15;
  undefined8 uVar16;
  long lVar17;
  void *pvVar18;
  PaAlsaDeviceInfo *devInfo;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  char *pcVar19;
  long lVar20;
  PaError PVar21;
  PaAlsaDeviceInfo *devInfo_00;
  char *pcVar22;
  char *pcVar23;
  byte bVar24;
  byte *pbVar25;
  byte *pbVar26;
  byte bVar27;
  byte bVar28;
  ulong uVar29;
  HwDevInfo *pHVar30;
  char acStack_130 [16];
  char alsaCardName [50];
  char *local_e8;
  char buf [50];
  char *local_a8;
  char *alsaDeviceName;
  char *local_98;
  uint local_8c;
  undefined8 local_88;
  snd_config_t *topNode;
  ulong local_78;
  ulong local_70;
  uint local_64;
  byte *local_60;
  char *cardName;
  undefined8 local_50;
  snd_ctl_t *ctl;
  int local_40;
  int local_3c;
  int devIdx;
  int devIdx_1;
  
  local_40 = 0;
  local_88 = 0;
  acStack_130[0] = -0x6c;
  acStack_130[1] = -0x1f;
  acStack_130[2] = '\x10';
  acStack_130[3] = '\0';
  acStack_130[4] = '\0';
  acStack_130[5] = '\0';
  acStack_130[6] = '\0';
  acStack_130[7] = '\0';
  pcVar9 = getenv("PA_ALSA_INITIALIZE_BLOCK");
  if (pcVar9 == (char *)0x0) {
    local_64 = 1;
  }
  else {
    acStack_130[0] = -0x5f;
    acStack_130[1] = -0x1f;
    acStack_130[2] = '\x10';
    acStack_130[3] = '\0';
    acStack_130[4] = '\0';
    acStack_130[5] = '\0';
    acStack_130[6] = '\0';
    acStack_130[7] = '\0';
    iVar6 = atoi(pcVar9);
    local_64 = (uint)(iVar6 == 0);
  }
  acStack_130[0] = -0x40;
  acStack_130[1] = -0x1f;
  acStack_130[2] = '\x10';
  acStack_130[3] = '\0';
  acStack_130[4] = '\0';
  acStack_130[5] = '\0';
  acStack_130[6] = '\0';
  acStack_130[7] = '\0';
  pcVar9 = getenv("PA_ALSA_PLUGHW");
  if (pcVar9 == (char *)0x0) {
    topNode._4_4_ = 0;
    local_98 = "";
  }
  else {
    acStack_130[0] = -0x33;
    acStack_130[1] = -0x1f;
    acStack_130[2] = '\x10';
    acStack_130[3] = '\0';
    acStack_130[4] = '\0';
    acStack_130[5] = '\0';
    acStack_130[6] = '\0';
    acStack_130[7] = '\0';
    iVar6 = atoi(pcVar9);
    topNode._4_4_ = (uint)(iVar6 != 0);
    local_98 = "";
    if (iVar6 != 0) {
      local_98 = "plug";
    }
  }
  (alsaApi->baseHostApiRep).info.defaultInputDevice = -1;
  (alsaApi->baseHostApiRep).info.defaultOutputDevice = -1;
  topNode._0_4_ = -1;
  acStack_130[0] = '\x1f';
  acStack_130[1] = -0x1e;
  acStack_130[2] = '\x10';
  acStack_130[3] = '\0';
  acStack_130[4] = '\0';
  acStack_130[5] = '\0';
  acStack_130[6] = '\0';
  acStack_130[7] = '\0';
  sVar10 = snd_ctl_card_info_sizeof();
  lVar20 = -(sVar10 + 0xf & 0xfffffffffffffff0);
  pcVar9 = acStack_130 + lVar20 + 8;
  psVar13 = (snd_ctl_t *)0x0;
  pcVar22 = acStack_130 + lVar20;
  alsaDeviceName = pcVar9;
  pcVar22[0] = 'D';
  pcVar22[1] = -0x1e;
  pcVar22[2] = '\x10';
  pcVar22[3] = '\0';
  pcVar22[4] = '\0';
  pcVar22[5] = '\0';
  pcVar22[6] = '\0';
  pcVar22[7] = '\0';
  memset(pcVar9,0,sVar10);
  pcVar23 = acStack_130 + lVar20;
  pcVar23[0] = 'I';
  pcVar23[1] = -0x1e;
  pcVar23[2] = '\x10';
  pcVar23[3] = '\0';
  pcVar23[4] = '\0';
  pcVar23[5] = '\0';
  pcVar23[6] = '\0';
  pcVar23[7] = '\0';
  sVar10 = snd_pcm_info_sizeof();
  pcVar9 = pcVar9 + -(sVar10 + 0xf & 0xfffffffffffffff0);
  pcVar9[-8] = 'g';
  pcVar9[-7] = -0x1e;
  pcVar9[-6] = '\x10';
  pcVar9[-5] = '\0';
  pcVar9[-4] = '\0';
  pcVar9[-3] = '\0';
  pcVar9[-2] = '\0';
  pcVar9[-1] = '\0';
  memset(pcVar9,0,sVar10);
  pcVar9[-8] = 'o';
  pcVar9[-7] = -0x1e;
  pcVar9[-6] = '\x10';
  pcVar9[-5] = '\0';
  pcVar9[-4] = '\0';
  pcVar9[-3] = '\0';
  pcVar9[-2] = '\0';
  pcVar9[-1] = '\0';
  iVar6 = snd_card_next(&topNode);
  uVar29 = 1;
  cardName = (char *)alsaApi;
  if ((int)topNode < 0 || iVar6 != 0) {
    _devIdx = 0;
  }
  else {
    _devIdx = 0;
    psVar13 = (snd_ctl_t *)0x0;
    do {
      local_3c = -1;
      pcVar9[-8] = -0x41;
      pcVar9[-7] = -0x1e;
      pcVar9[-6] = '\x10';
      pcVar9[-5] = '\0';
      pcVar9[-4] = '\0';
      pcVar9[-3] = '\0';
      pcVar9[-2] = '\0';
      pcVar9[-1] = '\0';
      snprintf(acStack_130 + 8,0x32,"hw:%d");
      pcVar9[-8] = -0x33;
      pcVar9[-7] = -0x1e;
      pcVar9[-6] = '\x10';
      pcVar9[-5] = '\0';
      pcVar9[-4] = '\0';
      pcVar9[-3] = '\0';
      pcVar9[-2] = '\0';
      pcVar9[-1] = '\0';
      iVar6 = snd_ctl_open(&local_50,acStack_130 + 8,0);
      uVar4 = local_50;
      pcVar11 = alsaDeviceName;
      if (-1 < iVar6) {
        pcVar9[-8] = -0x18;
        pcVar9[-7] = -0x1e;
        pcVar9[-6] = '\x10';
        pcVar9[-5] = '\0';
        pcVar9[-4] = '\0';
        pcVar9[-3] = '\0';
        pcVar9[-2] = '\0';
        pcVar9[-1] = '\0';
        snd_ctl_card_info(uVar4,pcVar11);
        pcVar9[-8] = -0x10;
        pcVar9[-7] = -0x1e;
        pcVar9[-6] = '\x10';
        pcVar9[-5] = '\0';
        pcVar9[-4] = '\0';
        pcVar9[-3] = '\0';
        pcVar9[-2] = '\0';
        pcVar9[-1] = '\0';
        pcVar11 = (char *)snd_ctl_card_info_get_name(pcVar11);
        pPVar2 = *(PaAlsaHostApiRepresentation **)(cardName + 0x108);
        pcVar9[-8] = '\a';
        pcVar9[-7] = -0x1d;
        pcVar9[-6] = '\x10';
        pcVar9[-5] = '\0';
        pcVar9[-4] = '\0';
        pcVar9[-3] = '\0';
        pcVar9[-2] = '\0';
        pcVar9[-1] = '\0';
        paUtilErr_ = PaAlsa_StrDup(pPVar2,(char **)&local_60,pcVar11);
        uVar4 = local_50;
        if (paUtilErr_ < 0) {
          pcVar11 = 
          "Expression \'PaAlsa_StrDup( alsaApi, &cardName, alsa_snd_ctl_card_info_get_name( cardInfo ))\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/philburk[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1296\n"
          ;
LAB_0010e9dc:
          pcVar9[-8] = -0x1d;
          pcVar9[-7] = -0x17;
          pcVar9[-6] = '\x10';
          pcVar9[-5] = '\0';
          pcVar9[-4] = '\0';
          pcVar9[-3] = '\0';
          pcVar9[-2] = '\0';
          pcVar9[-1] = '\0';
          PaUtil_DebugPrint(pcVar11);
          return paUtilErr_;
        }
        pcVar9[-8] = '\"';
        pcVar9[-7] = -0x1d;
        pcVar9[-6] = '\x10';
        pcVar9[-5] = '\0';
        pcVar9[-4] = '\0';
        pcVar9[-3] = '\0';
        pcVar9[-2] = '\0';
        pcVar9[-1] = '\0';
        iVar6 = snd_ctl_pcm_next_device(uVar4,&local_3c);
        if (-1 < local_3c && iVar6 == 0) {
          do {
            pcVar11 = local_98;
            pcVar9[-8] = 'g';
            pcVar9[-7] = -0x1d;
            pcVar9[-6] = '\x10';
            pcVar9[-5] = '\0';
            pcVar9[-4] = '\0';
            pcVar9[-3] = '\0';
            pcVar9[-2] = '\0';
            pcVar9[-1] = '\0';
            snprintf((char *)&local_e8,0x32,"%s%s,%d",pcVar11,acStack_130 + 8);
            iVar6 = local_3c;
            pcVar9[-8] = 'r';
            pcVar9[-7] = -0x1d;
            pcVar9[-6] = '\x10';
            pcVar9[-5] = '\0';
            pcVar9[-4] = '\0';
            pcVar9[-3] = '\0';
            pcVar9[-2] = '\0';
            pcVar9[-1] = '\0';
            snd_pcm_info_set_device(pcVar9,iVar6);
            pcVar9[-8] = '|';
            pcVar9[-7] = -0x1d;
            pcVar9[-6] = '\x10';
            pcVar9[-5] = '\0';
            pcVar9[-4] = '\0';
            pcVar9[-3] = '\0';
            pcVar9[-2] = '\0';
            pcVar9[-1] = '\0';
            snd_pcm_info_set_subdevice(pcVar9,0);
            pcVar9[-8] = -0x77;
            pcVar9[-7] = -0x1d;
            pcVar9[-6] = '\x10';
            pcVar9[-5] = '\0';
            pcVar9[-4] = '\0';
            pcVar9[-3] = '\0';
            pcVar9[-2] = '\0';
            pcVar9[-1] = '\0';
            snd_pcm_info_set_stream(pcVar9,1);
            uVar4 = local_50;
            pcVar9[-8] = -0x6b;
            pcVar9[-7] = -0x1d;
            pcVar9[-6] = '\x10';
            pcVar9[-5] = '\0';
            pcVar9[-4] = '\0';
            pcVar9[-3] = '\0';
            pcVar9[-2] = '\0';
            pcVar9[-1] = '\0';
            uVar7 = snd_ctl_pcm_info(uVar4,pcVar9);
            pcVar9[-8] = -0x5e;
            pcVar9[-7] = -0x1d;
            pcVar9[-6] = '\x10';
            pcVar9[-5] = '\0';
            pcVar9[-4] = '\0';
            pcVar9[-3] = '\0';
            pcVar9[-2] = '\0';
            pcVar9[-1] = '\0';
            snd_pcm_info_set_stream(pcVar9,0);
            uVar4 = local_50;
            pcVar9[-8] = -0x52;
            pcVar9[-7] = -0x1d;
            pcVar9[-6] = '\x10';
            pcVar9[-5] = '\0';
            pcVar9[-4] = '\0';
            pcVar9[-3] = '\0';
            pcVar9[-2] = '\0';
            pcVar9[-1] = '\0';
            uVar8 = snd_ctl_pcm_info(uVar4,pcVar9);
            local_78 = CONCAT44(local_78._4_4_,uVar7);
            if (-1 < (int)(uVar8 & uVar7)) {
              local_8c = uVar8;
              pcVar9[-8] = -0x37;
              pcVar9[-7] = -0x1d;
              pcVar9[-6] = '\x10';
              pcVar9[-5] = '\0';
              pcVar9[-4] = '\0';
              pcVar9[-3] = '\0';
              pcVar9[-2] = '\0';
              pcVar9[-1] = '\0';
              pbVar12 = (byte *)snd_pcm_info_get_name();
              pbVar5 = local_60;
              bVar28 = *pbVar12;
              bVar27 = *local_60;
              bVar24 = bVar28;
              pbVar25 = local_60;
              while (bVar27 != 0) {
                pbVar26 = pbVar12;
                bVar28 = bVar24;
                bVar27 = bVar24;
                if (bVar24 == 0) {
                  bVar24 = 0;
                  bVar28 = 0;
                }
                else {
                  do {
                    pbVar26 = pbVar26 + 1;
                    if (bVar27 != *pbVar25) break;
                    bVar27 = *pbVar26;
                    if ((bVar27 & 0xdf) == 0) {
                      pbVar12 = pbVar26;
                      bVar28 = bVar27;
                      bVar24 = bVar27;
                    }
                    pbVar25 = pbVar25 + 1;
                  } while (bVar27 != 0);
                }
                do {
                  bVar27 = *pbVar25;
                  if (bVar27 == 0) goto LAB_0010e42c;
                  pbVar25 = pbVar25 + 1;
                } while (bVar27 != 0x20);
                bVar27 = *pbVar25;
              }
LAB_0010e42c:
              pbVar25 = (byte *)"-";
              if (bVar28 != 0) {
                while (bVar28 == 0x20) {
                  pbVar25 = pbVar12 + 1;
                  pbVar12 = pbVar12 + 1;
                  bVar28 = *pbVar25;
                }
                if ((bVar28 == 0x2d) || (pbVar25 = pbVar12, bVar28 == 0x3a)) {
                  pbVar25 = pbVar12 + (ulong)(pbVar12[1] == 0x20) * 2;
                }
              }
              local_70 = uVar29;
              ctl = psVar13;
              pcVar9[-8] = -0x78;
              pcVar9[-7] = -0x1c;
              pcVar9[-6] = '\x10';
              pcVar9[-5] = '\0';
              pcVar9[-4] = '\0';
              pcVar9[-3] = '\0';
              pcVar9[-2] = '\0';
              pcVar9[-1] = '\0';
              iVar6 = snprintf((char *)0x0,0,"%s: %s (%s)",pbVar5,pbVar25,&local_e8);
              pPVar3 = *(PaUtilAllocationGroup **)(cardName + 0x108);
              pcVar9[-8] = -0x5d;
              pcVar9[-7] = -0x1c;
              pcVar9[-6] = '\x10';
              pcVar9[-5] = '\0';
              pcVar9[-4] = '\0';
              pcVar9[-3] = '\0';
              pcVar9[-2] = '\0';
              pcVar9[-1] = '\0';
              pcVar11 = (char *)PaUtil_GroupAllocateMemory(pPVar3,(long)(iVar6 + 1));
              pbVar12 = local_60;
              if (pcVar11 == (char *)0x0) {
                pcVar11 = 
                "Expression \'deviceName = (char *)PaUtil_GroupAllocateMemory( alsaApi->allocations, len )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/philburk[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1332\n"
                ;
                goto LAB_0010e9f2;
              }
              pcVar9[-8] = -0x33;
              pcVar9[-7] = -0x1c;
              pcVar9[-6] = '\x10';
              pcVar9[-5] = '\0';
              pcVar9[-4] = '\0';
              pcVar9[-3] = '\0';
              pcVar9[-2] = '\0';
              pcVar9[-1] = '\0';
              snprintf(pcVar11,(long)(iVar6 + 1),"%s: %s (%s)",pbVar12,pbVar25,&local_e8);
              psVar13 = ctl;
              uVar29 = local_70;
              uVar1 = _devIdx + 1;
              if ((ctl == (snd_ctl_t *)0x0) || (local_70 < uVar1)) {
                sVar10 = local_70 << 6;
                pcVar9[-8] = -10;
                pcVar9[-7] = -0x1c;
                pcVar9[-6] = '\x10';
                pcVar9[-5] = '\0';
                pcVar9[-4] = '\0';
                pcVar9[-3] = '\0';
                pcVar9[-2] = '\0';
                pcVar9[-1] = '\0';
                psVar13 = (snd_ctl_t *)realloc(psVar13,sVar10);
                if (psVar13 == (snd_ctl_t *)0x0) {
                  pcVar11 = 
                  "Expression \'hwDevInfos = (HwDevInfo *) realloc( hwDevInfos, maxDeviceNames * sizeof (HwDevInfo) )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/philburk[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1342\n"
                  ;
                  goto LAB_0010e9f2;
                }
                uVar29 = uVar29 * 2;
              }
              pPVar2 = *(PaAlsaHostApiRepresentation **)(cardName + 0x108);
              pcVar9[-8] = '#';
              pcVar9[-7] = -0x1b;
              pcVar9[-6] = '\x10';
              pcVar9[-5] = '\0';
              pcVar9[-4] = '\0';
              pcVar9[-3] = '\0';
              pcVar9[-2] = '\0';
              pcVar9[-1] = '\0';
              paUtilErr_ = PaAlsa_StrDup(pPVar2,&local_a8,(char *)&local_e8);
              if (paUtilErr_ < 0) {
                pcVar11 = 
                "Expression \'PaAlsa_StrDup( alsaApi, &alsaDeviceName, buf )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/philburk[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1345\n"
                ;
                goto LAB_0010e9dc;
              }
              lVar20 = _devIdx * 0x20;
              *(char **)(psVar13 + lVar20) = local_a8;
              *(char **)(psVar13 + lVar20 + 8) = pcVar11;
              *(uint *)(psVar13 + lVar20 + 0x10) = topNode._4_4_;
              *(ulong *)(psVar13 + lVar20 + 0x14) =
                   CONCAT44(-(uint)(-1 < (int)local_78) >> 0x1f,-(uint)(-1 < (int)local_8c) >> 0x1f)
              ;
              _devIdx = uVar1;
            }
            uVar4 = local_50;
            pcVar9[-8] = -0x72;
            pcVar9[-7] = -0x1b;
            pcVar9[-6] = '\x10';
            pcVar9[-5] = '\0';
            pcVar9[-4] = '\0';
            pcVar9[-3] = '\0';
            pcVar9[-2] = '\0';
            pcVar9[-1] = '\0';
            iVar6 = snd_ctl_pcm_next_device(uVar4,&local_3c);
          } while ((iVar6 == 0) && (-1 < local_3c));
        }
        uVar4 = local_50;
        pcVar9[-8] = -0x58;
        pcVar9[-7] = -0x1b;
        pcVar9[-6] = '\x10';
        pcVar9[-5] = '\0';
        pcVar9[-4] = '\0';
        pcVar9[-3] = '\0';
        pcVar9[-2] = '\0';
        pcVar9[-1] = '\0';
        snd_ctl_close(uVar4);
      }
      pcVar9[-8] = -0x4f;
      pcVar9[-7] = -0x1b;
      pcVar9[-6] = '\x10';
      pcVar9[-5] = '\0';
      pcVar9[-4] = '\0';
      pcVar9[-3] = '\0';
      pcVar9[-2] = '\0';
      pcVar9[-1] = '\0';
      iVar6 = snd_card_next(&topNode);
    } while ((iVar6 == 0) && (-1 < (int)topNode));
  }
  if (_snd_config == 0) {
    pcVar9[-8] = -0x22;
    pcVar9[-7] = -0x1b;
    pcVar9[-6] = '\x10';
    pcVar9[-5] = '\0';
    pcVar9[-4] = '\0';
    pcVar9[-3] = '\0';
    pcVar9[-2] = '\0';
    pcVar9[-1] = '\0';
    iVar6 = snd_config_update();
    if (iVar6 < 0) {
      pcVar9[-8] = -0x49;
      pcVar9[-7] = -0x16;
      pcVar9[-6] = '\x10';
      pcVar9[-5] = '\0';
      pcVar9[-4] = '\0';
      pcVar9[-3] = '\0';
      pcVar9[-2] = '\0';
      pcVar9[-1] = '\0';
      BuildDeviceList_cold_4();
      return -9999;
    }
    if (_snd_config == 0) {
      *(code **)(pcVar9 + -8) = CloseStream;
      __assert_fail("*alsa_snd_config",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/philburk[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c"
                    ,0x553,"PaError BuildDeviceList(PaAlsaHostApiRepresentation *)");
    }
  }
  pcVar9[-8] = '\x02';
  pcVar9[-7] = -0x1a;
  pcVar9[-6] = '\x10';
  pcVar9[-5] = '\0';
  pcVar9[-4] = '\0';
  pcVar9[-3] = '\0';
  pcVar9[-2] = '\0';
  pcVar9[-1] = '\0';
  iVar6 = snd_config_search(_snd_config,"pcm",&local_88);
  uVar4 = local_88;
  ctl = psVar13;
  if (-1 < iVar6) {
    local_70 = uVar29;
    pcVar9[-8] = '\x1b';
    pcVar9[-7] = -0x1a;
    pcVar9[-6] = '\x10';
    pcVar9[-5] = '\0';
    pcVar9[-4] = '\0';
    pcVar9[-3] = '\0';
    pcVar9[-2] = '\0';
    pcVar9[-1] = '\0';
    lVar14 = snd_config_iterator_first(uVar4);
    pcVar9[-8] = '&';
    pcVar9[-7] = -0x1a;
    pcVar9[-6] = '\x10';
    pcVar9[-5] = '\0';
    pcVar9[-4] = '\0';
    pcVar9[-3] = '\0';
    pcVar9[-2] = '\0';
    pcVar9[-1] = '\0';
    lVar20 = snd_config_iterator_next(lVar14);
    uVar4 = local_88;
    pcVar9[-8] = '2';
    pcVar9[-7] = -0x1a;
    pcVar9[-6] = '\x10';
    pcVar9[-5] = '\0';
    pcVar9[-4] = '\0';
    pcVar9[-3] = '\0';
    pcVar9[-2] = '\0';
    pcVar9[-1] = '\0';
    lVar15 = snd_config_iterator_end(uVar4);
    if (lVar14 != lVar15) {
      do {
        lVar15 = lVar20;
        local_e8 = "unknown";
        local_60 = (byte *)0x0;
        pcVar9[-8] = 'b';
        pcVar9[-7] = -0x1a;
        pcVar9[-6] = '\x10';
        pcVar9[-5] = '\0';
        pcVar9[-4] = '\0';
        pcVar9[-3] = '\0';
        pcVar9[-2] = '\0';
        pcVar9[-1] = '\0';
        uVar16 = snd_config_iterator_entry(lVar14);
        local_50 = 0;
        pcVar9[-8] = '|';
        pcVar9[-7] = -0x1a;
        pcVar9[-6] = '\x10';
        pcVar9[-5] = '\0';
        pcVar9[-4] = '\0';
        pcVar9[-3] = '\0';
        pcVar9[-2] = '\0';
        pcVar9[-1] = '\0';
        iVar6 = snd_config_search(uVar16,"type",&local_50);
        uVar4 = local_50;
        if (iVar6 < 0) {
          if (iVar6 == -2) goto LAB_0010e6a5;
          pcVar11 = 
          "Expression \'err\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/philburk[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1381\n"
          ;
          pcVar9[-8] = '\x11';
          pcVar9[-7] = -0x16;
          pcVar9[-6] = '\x10';
          pcVar9[-5] = '\0';
          pcVar9[-4] = '\0';
          pcVar9[-3] = '\0';
          pcVar9[-2] = '\0';
          pcVar9[-1] = '\0';
          BuildDeviceList_cold_3();
          uVar29 = extraout_RAX;
LAB_0010ea46:
          PVar21 = -9999;
          if ((uVar29 & 1) == 0) {
            pcVar9[-8] = 'T';
            pcVar9[-7] = -0x16;
            pcVar9[-6] = '\x10';
            pcVar9[-5] = '\0';
            pcVar9[-4] = '\0';
            pcVar9[-3] = '\0';
            pcVar9[-2] = '\0';
            pcVar9[-1] = '\0';
            pcVar19 = (char *)snd_strerror(iVar6);
            pcVar9[-8] = 'd';
            pcVar9[-7] = -0x16;
            pcVar9[-6] = '\x10';
            pcVar9[-5] = '\0';
            pcVar9[-4] = '\0';
            pcVar9[-3] = '\0';
            pcVar9[-2] = '\0';
            pcVar9[-1] = '\0';
            PaUtil_SetLastHostErrorInfo(paALSA,(long)iVar6,pcVar19);
            PVar21 = -9999;
          }
LAB_0010ea89:
          pcVar9[-8] = -0x6d;
          pcVar9[-7] = -0x16;
          pcVar9[-6] = '\x10';
          pcVar9[-5] = '\0';
          pcVar9[-4] = '\0';
          pcVar9[-3] = '\0';
          pcVar9[-2] = '\0';
          pcVar9[-1] = '\0';
          PaUtil_DebugPrint(pcVar11);
          return PVar21;
        }
        pcVar9[-8] = -0x70;
        pcVar9[-7] = -0x1a;
        pcVar9[-6] = '\x10';
        pcVar9[-5] = '\0';
        pcVar9[-4] = '\0';
        pcVar9[-3] = '\0';
        pcVar9[-2] = '\0';
        pcVar9[-1] = '\0';
        iVar6 = snd_config_get_string(uVar4,&local_e8);
        if (iVar6 < 0) {
          pcVar11 = 
          "Expression \'alsa_snd_config_get_string( tp, &tpStr )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/philburk[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1386\n"
          ;
          pcVar9[-8] = 'F';
          pcVar9[-7] = -0x16;
          pcVar9[-6] = '\x10';
          pcVar9[-5] = '\0';
          pcVar9[-4] = '\0';
          pcVar9[-3] = '\0';
          pcVar9[-2] = '\0';
          pcVar9[-1] = '\0';
          BuildDeviceList_cold_1();
          uVar29 = extraout_RAX_01;
          goto LAB_0010ea46;
        }
LAB_0010e6a5:
        pcVar9[-8] = -0x4f;
        pcVar9[-7] = -0x1a;
        pcVar9[-6] = '\x10';
        pcVar9[-5] = '\0';
        pcVar9[-4] = '\0';
        pcVar9[-3] = '\0';
        pcVar9[-2] = '\0';
        pcVar9[-1] = '\0';
        iVar6 = snd_config_get_id(uVar16,&local_60);
        pbVar12 = local_60;
        if (iVar6 < 0) {
          pcVar11 = 
          "Expression \'alsa_snd_config_get_id( n, &idStr )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/philburk[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1388\n"
          ;
          pcVar9[-8] = '\'';
          pcVar9[-7] = -0x16;
          pcVar9[-6] = '\x10';
          pcVar9[-5] = '\0';
          pcVar9[-4] = '\0';
          pcVar9[-3] = '\0';
          pcVar9[-2] = '\0';
          pcVar9[-1] = '\0';
          BuildDeviceList_cold_2();
          uVar29 = extraout_RAX_00;
          goto LAB_0010ea46;
        }
        pcVar9[-8] = -0x37;
        pcVar9[-7] = -0x1a;
        pcVar9[-6] = '\x10';
        pcVar9[-5] = '\0';
        pcVar9[-4] = '\0';
        pcVar9[-3] = '\0';
        pcVar9[-2] = '\0';
        pcVar9[-1] = '\0';
        pcVar11 = getenv("PA_ALSA_IGNORE_ALL_PLUGINS");
        if (pcVar11 == (char *)0x0) {
LAB_0010e6e3:
          lVar20 = 0;
          do {
            pcVar11 = *(char **)((long)&IgnorePlugin_ignoredPlugins + lVar20);
            pcVar9[-8] = -0xe;
            pcVar9[-7] = -0x1a;
            pcVar9[-6] = '\x10';
            pcVar9[-5] = '\0';
            pcVar9[-4] = '\0';
            pcVar9[-3] = '\0';
            pcVar9[-2] = '\0';
            pcVar9[-1] = '\0';
            iVar6 = strcmp((char *)pbVar12,pcVar11);
            pcVar11 = cardName;
            uVar29 = _devIdx;
            if (iVar6 == 0) goto LAB_0010e856;
            lVar20 = lVar20 + 8;
          } while (lVar20 != 0x50);
          pPVar3 = *(PaUtilAllocationGroup **)(cardName + 0x108);
          pcVar9[-8] = '\x13';
          pcVar9[-7] = -0x19;
          pcVar9[-6] = '\x10';
          pcVar9[-5] = '\0';
          pcVar9[-4] = '\0';
          pcVar9[-3] = '\0';
          pcVar9[-2] = '\0';
          pcVar9[-1] = '\0';
          sVar10 = strlen((char *)pbVar12);
          pcVar9[-8] = '\x1f';
          pcVar9[-7] = -0x19;
          pcVar9[-6] = '\x10';
          pcVar9[-5] = '\0';
          pcVar9[-4] = '\0';
          pcVar9[-3] = '\0';
          pcVar9[-2] = '\0';
          pcVar9[-1] = '\0';
          pcVar19 = (char *)PaUtil_GroupAllocateMemory(pPVar3,sVar10 + 6);
          pbVar12 = local_60;
          if (pcVar19 == (char *)0x0) {
            pcVar11 = 
            "Expression \'alsaDeviceName = (char*)PaUtil_GroupAllocateMemory( alsaApi->allocations, strlen(idStr) + 6 )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/philburk[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1397\n"
            ;
          }
          else {
            pcVar9[-8] = ':';
            pcVar9[-7] = -0x19;
            pcVar9[-6] = '\x10';
            pcVar9[-5] = '\0';
            pcVar9[-4] = '\0';
            pcVar9[-3] = '\0';
            pcVar9[-2] = '\0';
            pcVar9[-1] = '\0';
            strcpy(pcVar19,(char *)pbVar12);
            pbVar12 = local_60;
            pPVar3 = *(PaUtilAllocationGroup **)(pcVar11 + 0x108);
            pcVar9[-8] = 'J';
            pcVar9[-7] = -0x19;
            pcVar9[-6] = '\x10';
            pcVar9[-5] = '\0';
            pcVar9[-4] = '\0';
            pcVar9[-3] = '\0';
            pcVar9[-2] = '\0';
            pcVar9[-1] = '\0';
            sVar10 = strlen((char *)pbVar12);
            pcVar9[-8] = 'V';
            pcVar9[-7] = -0x19;
            pcVar9[-6] = '\x10';
            pcVar9[-5] = '\0';
            pcVar9[-4] = '\0';
            pcVar9[-3] = '\0';
            pcVar9[-2] = '\0';
            pcVar9[-1] = '\0';
            pcVar11 = (char *)PaUtil_GroupAllocateMemory(pPVar3,sVar10 + 1);
            pbVar12 = local_60;
            if (pcVar11 != (char *)0x0) {
              pcVar9[-8] = 'n';
              pcVar9[-7] = -0x19;
              pcVar9[-6] = '\x10';
              pcVar9[-5] = '\0';
              pcVar9[-4] = '\0';
              pcVar9[-3] = '\0';
              pcVar9[-2] = '\0';
              pcVar9[-1] = '\0';
              strcpy(pcVar11,(char *)pbVar12);
              psVar13 = ctl;
              uVar29 = local_70;
              local_78 = _devIdx + 1;
              if ((ctl == (snd_ctl_t *)0x0) || (local_70 < local_78)) {
                sVar10 = local_70 << 6;
                pcVar9[-8] = -0x66;
                pcVar9[-7] = -0x19;
                pcVar9[-6] = '\x10';
                pcVar9[-5] = '\0';
                pcVar9[-4] = '\0';
                pcVar9[-3] = '\0';
                pcVar9[-2] = '\0';
                pcVar9[-1] = '\0';
                ctl = (snd_ctl_t *)realloc(psVar13,sVar10);
                if (ctl == (snd_ctl_t *)0x0) {
                  pcVar11 = 
                  "Expression \'hwDevInfos = (HwDevInfo *) realloc( hwDevInfos, maxDeviceNames * sizeof (HwDevInfo) )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/philburk[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1408\n"
                  ;
                  goto LAB_0010ea84;
                }
                local_70 = uVar29 * 2;
              }
              if (predefinedNames[0].alsaName == (char *)0x0) {
LAB_0010e81e:
                lVar20 = _devIdx * 0x20;
                *(char **)(ctl + lVar20) = pcVar19;
                *(char **)(ctl + lVar20 + 8) = pcVar11;
                *(undefined8 *)(ctl + lVar20 + 0x10) = 0x100000001;
                iVar6 = 1;
              }
              else {
                pcVar9[-8] = -0x3b;
                pcVar9[-7] = -0x19;
                pcVar9[-6] = '\x10';
                pcVar9[-5] = '\0';
                pcVar9[-4] = '\0';
                pcVar9[-3] = '\0';
                pcVar9[-2] = '\0';
                pcVar9[-1] = '\0';
                iVar6 = strcmp(pcVar19,predefinedNames[0].alsaName);
                pHVar30 = predefinedNames;
                if (iVar6 != 0) {
                  pHVar30 = predefinedNames;
                  do {
                    __s2 = pHVar30[1].alsaName;
                    if (__s2 == (char *)0x0) goto LAB_0010e81e;
                    pcVar9[-8] = -0x18;
                    pcVar9[-7] = -0x19;
                    pcVar9[-6] = '\x10';
                    pcVar9[-5] = '\0';
                    pcVar9[-4] = '\0';
                    pcVar9[-3] = '\0';
                    pcVar9[-2] = '\0';
                    pcVar9[-1] = '\0';
                    iVar6 = strcmp(pcVar19,__s2);
                    pHVar30 = pHVar30 + 1;
                  } while (iVar6 != 0);
                }
                lVar20 = _devIdx * 0x20;
                *(char **)(ctl + lVar20) = pcVar19;
                *(char **)(ctl + lVar20 + 8) = pcVar11;
                *(undefined4 *)(ctl + lVar20 + 0x10) = 1;
                *(int *)(ctl + lVar20 + 0x14) = pHVar30->hasPlayback;
                iVar6 = pHVar30->hasCapture;
              }
              *(int *)(ctl + _devIdx * 0x20 + 0x18) = iVar6;
              uVar29 = local_78;
              goto LAB_0010e856;
            }
            pcVar11 = 
            "Expression \'deviceName = (char*)PaUtil_GroupAllocateMemory( alsaApi->allocations, strlen(idStr) + 1 )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/philburk[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1400\n"
            ;
          }
LAB_0010ea84:
          PVar21 = -0x2708;
          goto LAB_0010ea89;
        }
        pcVar9[-8] = -0x2a;
        pcVar9[-7] = -0x1a;
        pcVar9[-6] = '\x10';
        pcVar9[-5] = '\0';
        pcVar9[-4] = '\0';
        pcVar9[-3] = '\0';
        pcVar9[-2] = '\0';
        pcVar9[-1] = '\0';
        iVar6 = atoi(pcVar11);
        uVar29 = _devIdx;
        if (iVar6 == 0) goto LAB_0010e6e3;
LAB_0010e856:
        pcVar9[-8] = '^';
        pcVar9[-7] = -0x18;
        pcVar9[-6] = '\x10';
        pcVar9[-5] = '\0';
        pcVar9[-4] = '\0';
        pcVar9[-3] = '\0';
        pcVar9[-2] = '\0';
        pcVar9[-1] = '\0';
        lVar20 = snd_config_iterator_next(lVar15);
        uVar4 = local_88;
        pcVar9[-8] = 'j';
        pcVar9[-7] = -0x18;
        pcVar9[-6] = '\x10';
        pcVar9[-5] = '\0';
        pcVar9[-4] = '\0';
        pcVar9[-3] = '\0';
        pcVar9[-2] = '\0';
        pcVar9[-1] = '\0';
        lVar17 = snd_config_iterator_end(uVar4);
        lVar14 = lVar15;
        _devIdx = uVar29;
      } while (lVar15 != lVar17);
    }
  }
  uVar29 = _devIdx;
  pcVar11 = cardName;
  pPVar3 = *(PaUtilAllocationGroup **)(cardName + 0x108);
  lVar20 = _devIdx * 8;
  pcVar9[-8] = -0x6b;
  pcVar9[-7] = -0x18;
  pcVar9[-6] = '\x10';
  pcVar9[-5] = '\0';
  pcVar9[-4] = '\0';
  pcVar9[-3] = '\0';
  pcVar9[-2] = '\0';
  pcVar9[-1] = '\0';
  pvVar18 = PaUtil_GroupAllocateMemory(pPVar3,lVar20);
  *(void **)(pcVar11 + 0x28) = pvVar18;
  if (pvVar18 == (void *)0x0) {
    pcVar11 = 
    "Expression \'baseApi->deviceInfos = (PaDeviceInfo**)PaUtil_GroupAllocateMemory( alsaApi->allocations, sizeof(PaDeviceInfo*) * (numDeviceNames) )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/philburk[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1434\n"
    ;
  }
  else {
    pPVar3 = *(PaUtilAllocationGroup **)(pcVar11 + 0x108);
    pcVar9[-8] = -0x47;
    pcVar9[-7] = -0x18;
    pcVar9[-6] = '\x10';
    pcVar9[-5] = '\0';
    pcVar9[-4] = '\0';
    pcVar9[-3] = '\0';
    pcVar9[-2] = '\0';
    pcVar9[-1] = '\0';
    devInfo = (PaAlsaDeviceInfo *)PaUtil_GroupAllocateMemory(pPVar3,uVar29 * 0x60);
    if (devInfo != (PaAlsaDeviceInfo *)0x0) {
      local_40 = 0;
      devInfo_00 = devInfo;
      pHVar30 = (HwDevInfo *)ctl;
      uVar1 = uVar29;
      if (uVar29 != 0) {
        do {
          local_78 = uVar1;
          pcVar11 = pHVar30->name;
          pcVar9[-8] = -0xd;
          pcVar9[-7] = -0x18;
          pcVar9[-6] = '\x10';
          pcVar9[-5] = '\0';
          pcVar9[-4] = '\0';
          pcVar9[-3] = '\0';
          pcVar9[-2] = '\0';
          pcVar9[-1] = '\0';
          iVar6 = strcmp(pcVar11,"dmix");
          if (iVar6 != 0) {
            pcVar9[-8] = '\x06';
            pcVar9[-7] = -0x17;
            pcVar9[-6] = '\x10';
            pcVar9[-5] = '\0';
            pcVar9[-4] = '\0';
            pcVar9[-3] = '\0';
            pcVar9[-2] = '\0';
            pcVar9[-1] = '\0';
            iVar6 = strcmp(pcVar11,"default");
            pcVar11 = cardName;
            uVar7 = local_64;
            if (iVar6 != 0) {
              pcVar9[-8] = ' ';
              pcVar9[-7] = -0x17;
              pcVar9[-6] = '\x10';
              pcVar9[-5] = '\0';
              pcVar9[-4] = '\0';
              pcVar9[-3] = '\0';
              pcVar9[-2] = '\0';
              pcVar9[-1] = '\0';
              FillInDevInfo((PaAlsaHostApiRepresentation *)pcVar11,pHVar30,uVar7,devInfo_00,
                            &local_40);
              paUtilErr_ = 0;
            }
          }
          uVar29 = uVar29 - 1;
          devInfo_00 = devInfo_00 + 1;
          pHVar30 = pHVar30 + 1;
          uVar1 = local_78;
        } while (uVar29 != 0);
        uVar29 = local_78;
        pHVar30 = (HwDevInfo *)ctl;
        if (local_78 < (ulong)(long)local_40) {
          pcVar9[-8] = -0x20;
          pcVar9[-7] = -0x16;
          pcVar9[-6] = '\x10';
          pcVar9[-5] = '\0';
          pcVar9[-4] = '\0';
          pcVar9[-3] = '\0';
          pcVar9[-2] = '\0';
          pcVar9[-1] = '\0';
          __assert_fail("devIdx <= numDeviceNames",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/philburk[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c"
                        ,0x5b4,"PaError BuildDeviceList(PaAlsaHostApiRepresentation *)");
        }
        do {
          pcVar11 = pHVar30->name;
          pcVar9[-8] = 'b';
          pcVar9[-7] = -0x17;
          pcVar9[-6] = '\x10';
          pcVar9[-5] = '\0';
          pcVar9[-4] = '\0';
          pcVar9[-3] = '\0';
          pcVar9[-2] = '\0';
          pcVar9[-1] = '\0';
          iVar6 = strcmp(pcVar11,"dmix");
          if (iVar6 == 0) {
LAB_0010e979:
            pcVar11 = cardName;
            uVar7 = local_64;
            pcVar9[-8] = -0x71;
            pcVar9[-7] = -0x17;
            pcVar9[-6] = '\x10';
            pcVar9[-5] = '\0';
            pcVar9[-4] = '\0';
            pcVar9[-3] = '\0';
            pcVar9[-2] = '\0';
            pcVar9[-1] = '\0';
            FillInDevInfo((PaAlsaHostApiRepresentation *)pcVar11,pHVar30,uVar7,devInfo,&local_40);
            paUtilErr_ = 0;
          }
          else {
            pcVar9[-8] = 'u';
            pcVar9[-7] = -0x17;
            pcVar9[-6] = '\x10';
            pcVar9[-5] = '\0';
            pcVar9[-4] = '\0';
            pcVar9[-3] = '\0';
            pcVar9[-2] = '\0';
            pcVar9[-1] = '\0';
            iVar6 = strcmp(pcVar11,"default");
            if (iVar6 == 0) goto LAB_0010e979;
          }
          devInfo = devInfo + 1;
          uVar29 = uVar29 - 1;
          pHVar30 = pHVar30 + 1;
        } while (uVar29 != 0);
      }
      psVar13 = ctl;
      pcVar9[-8] = -0x51;
      pcVar9[-7] = -0x17;
      pcVar9[-6] = '\x10';
      pcVar9[-5] = '\0';
      pcVar9[-4] = '\0';
      pcVar9[-3] = '\0';
      pcVar9[-2] = '\0';
      pcVar9[-1] = '\0';
      free(psVar13);
      *(int *)(cardName + 0x18) = local_40;
      return 0;
    }
    pcVar11 = 
    "Expression \'deviceInfoArray = (PaAlsaDeviceInfo*)PaUtil_GroupAllocateMemory( alsaApi->allocations, sizeof(PaAlsaDeviceInfo) * numDeviceNames )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/philburk[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1438\n"
    ;
  }
LAB_0010e9f2:
  pcVar9[-8] = -7;
  pcVar9[-7] = -0x17;
  pcVar9[-6] = '\x10';
  pcVar9[-5] = '\0';
  pcVar9[-4] = '\0';
  pcVar9[-3] = '\0';
  pcVar9[-2] = '\0';
  pcVar9[-1] = '\0';
  PaUtil_DebugPrint(pcVar11);
  return -0x2708;
}

Assistant:

static PaError BuildDeviceList( PaAlsaHostApiRepresentation *alsaApi )
{
    PaUtilHostApiRepresentation *baseApi = &alsaApi->baseHostApiRep;
    PaAlsaDeviceInfo *deviceInfoArray;
    int cardIdx = -1, devIdx = 0;
    snd_ctl_card_info_t *cardInfo;
    PaError result = paNoError;
    size_t numDeviceNames = 0, maxDeviceNames = 1, i;
    HwDevInfo *hwDevInfos = NULL;
    snd_config_t *topNode = NULL;
    snd_pcm_info_t *pcmInfo;
    int res;
    int blocking = SND_PCM_NONBLOCK;
    int usePlughw = 0;
    char *hwPrefix = "";
    char alsaCardName[50];
#ifdef PA_ENABLE_DEBUG_OUTPUT
    PaTime startTime = PaUtil_GetTime();
#endif

    if( getenv( "PA_ALSA_INITIALIZE_BLOCK" ) && atoi( getenv( "PA_ALSA_INITIALIZE_BLOCK" ) ) )
        blocking = 0;

    /* If PA_ALSA_PLUGHW is 1 (non-zero), use the plughw: pcm throughout instead of hw: */
    if( getenv( "PA_ALSA_PLUGHW" ) && atoi( getenv( "PA_ALSA_PLUGHW" ) ) )
    {
        usePlughw = 1;
        hwPrefix = "plug";
        PA_DEBUG(( "%s: Using Plughw\n", __FUNCTION__ ));
    }

    /* These two will be set to the first working input and output device, respectively */
    baseApi->info.defaultInputDevice = paNoDevice;
    baseApi->info.defaultOutputDevice = paNoDevice;

    /* Gather info about hw devices

     * alsa_snd_card_next() modifies the integer passed to it to be:
     *      the index of the first card if the parameter is -1
     *      the index of the next card if the parameter is the index of a card
     *      -1 if there are no more cards
     *
     * The function itself returns 0 if it succeeded. */
    cardIdx = -1;
    alsa_snd_ctl_card_info_alloca( &cardInfo );
    alsa_snd_pcm_info_alloca( &pcmInfo );
    while( alsa_snd_card_next( &cardIdx ) == 0 && cardIdx >= 0 )
    {
        char *cardName;
        int devIdx = -1;
        snd_ctl_t *ctl;
        char buf[50];

        snprintf( alsaCardName, sizeof (alsaCardName), "hw:%d", cardIdx );

        /* Acquire name of card */
        if( alsa_snd_ctl_open( &ctl, alsaCardName, 0 ) < 0 )
        {
            /* Unable to open card :( */
            PA_DEBUG(( "%s: Unable to open device %s\n", __FUNCTION__, alsaCardName ));
            continue;
        }
        alsa_snd_ctl_card_info( ctl, cardInfo );

        PA_ENSURE( PaAlsa_StrDup( alsaApi, &cardName, alsa_snd_ctl_card_info_get_name( cardInfo )) );

        while( alsa_snd_ctl_pcm_next_device( ctl, &devIdx ) == 0 && devIdx >= 0 )
        {
            char *alsaDeviceName, *deviceName, *infoName;
            size_t len;
            int hasPlayback = 0, hasCapture = 0;

            snprintf( buf, sizeof (buf), "%s%s,%d", hwPrefix, alsaCardName, devIdx );

            /* Obtain info about this particular device */
            alsa_snd_pcm_info_set_device( pcmInfo, devIdx );
            alsa_snd_pcm_info_set_subdevice( pcmInfo, 0 );
            alsa_snd_pcm_info_set_stream( pcmInfo, SND_PCM_STREAM_CAPTURE );
            if( alsa_snd_ctl_pcm_info( ctl, pcmInfo ) >= 0 )
            {
                hasCapture = 1;
            }

            alsa_snd_pcm_info_set_stream( pcmInfo, SND_PCM_STREAM_PLAYBACK );
            if( alsa_snd_ctl_pcm_info( ctl, pcmInfo ) >= 0 )
            {
                hasPlayback = 1;
            }

            if( !hasPlayback && !hasCapture )
            {
                /* Error */
                continue;
            }

            infoName = SkipCardDetailsInName( (char *)alsa_snd_pcm_info_get_name( pcmInfo ), cardName );

            /* The length of the string written by snprintf plus terminating 0 */
            len = snprintf( NULL, 0, "%s: %s (%s)", cardName, infoName, buf ) + 1;
            PA_UNLESS( deviceName = (char *)PaUtil_GroupAllocateMemory( alsaApi->allocations, len ),
                    paInsufficientMemory );
            snprintf( deviceName, len, "%s: %s (%s)", cardName, infoName, buf );

            PA_DEBUG(( "%s: Found device [%d]: %s\n", __FUNCTION__, numDeviceNames, deviceName ));

            ++numDeviceNames;
            if( !hwDevInfos || numDeviceNames > maxDeviceNames )
            {
                maxDeviceNames *= 2;
                PA_UNLESS( hwDevInfos = (HwDevInfo *) realloc( hwDevInfos, maxDeviceNames * sizeof (HwDevInfo) ),
                        paInsufficientMemory );
            }

            PA_ENSURE( PaAlsa_StrDup( alsaApi, &alsaDeviceName, buf ) );

            hwDevInfos[ numDeviceNames - 1 ].alsaName = alsaDeviceName;
            hwDevInfos[ numDeviceNames - 1 ].name = deviceName;
            hwDevInfos[ numDeviceNames - 1 ].isPlug = usePlughw;
            hwDevInfos[ numDeviceNames - 1 ].hasPlayback = hasPlayback;
            hwDevInfos[ numDeviceNames - 1 ].hasCapture = hasCapture;
        }
        alsa_snd_ctl_close( ctl );
    }

    /* Iterate over plugin devices */
    if( NULL == (*alsa_snd_config) )
    {
        /* alsa_snd_config_update is called implicitly by some functions, if this hasn't happened snd_config will be NULL (bleh) */
        ENSURE_( alsa_snd_config_update(), paUnanticipatedHostError );
        PA_DEBUG(( "Updating snd_config\n" ));
    }
    assert( *alsa_snd_config );
    if( ( res = alsa_snd_config_search( *alsa_snd_config, "pcm", &topNode ) ) >= 0 )
    {
        snd_config_iterator_t i, next;

        alsa_snd_config_for_each( i, next, topNode )
        {
            const char *tpStr = "unknown", *idStr = NULL;
            int err = 0;

            char *alsaDeviceName, *deviceName;
            const HwDevInfo *predefined = NULL;
            snd_config_t *n = alsa_snd_config_iterator_entry( i ), * tp = NULL;;

            if( (err = alsa_snd_config_search( n, "type", &tp )) < 0 )
            {
                if( -ENOENT != err )
                {
                    ENSURE_(err, paUnanticipatedHostError);
                }
            }
            else
            {
                ENSURE_( alsa_snd_config_get_string( tp, &tpStr ), paUnanticipatedHostError );
            }
            ENSURE_( alsa_snd_config_get_id( n, &idStr ), paUnanticipatedHostError );
            if( IgnorePlugin( idStr ) )
            {
                PA_DEBUG(( "%s: Ignoring ALSA plugin device [%s] of type [%s]\n", __FUNCTION__, idStr, tpStr ));
                continue;
            }
            PA_DEBUG(( "%s: Found plugin [%s] of type [%s]\n", __FUNCTION__, idStr, tpStr ));

            PA_UNLESS( alsaDeviceName = (char*)PaUtil_GroupAllocateMemory( alsaApi->allocations,
                                                            strlen(idStr) + 6 ), paInsufficientMemory );
            strcpy( alsaDeviceName, idStr );
            PA_UNLESS( deviceName = (char*)PaUtil_GroupAllocateMemory( alsaApi->allocations,
                                                            strlen(idStr) + 1 ), paInsufficientMemory );
            strcpy( deviceName, idStr );

            ++numDeviceNames;
            if( !hwDevInfos || numDeviceNames > maxDeviceNames )
            {
                maxDeviceNames *= 2;
                PA_UNLESS( hwDevInfos = (HwDevInfo *) realloc( hwDevInfos, maxDeviceNames * sizeof (HwDevInfo) ),
                        paInsufficientMemory );
            }

            predefined = FindDeviceName( alsaDeviceName );

            hwDevInfos[numDeviceNames - 1].alsaName = alsaDeviceName;
            hwDevInfos[numDeviceNames - 1].name     = deviceName;
            hwDevInfos[numDeviceNames - 1].isPlug   = 1;

            if( predefined )
            {
                hwDevInfos[numDeviceNames - 1].hasPlayback = predefined->hasPlayback;
                hwDevInfos[numDeviceNames - 1].hasCapture  = predefined->hasCapture;
            }
            else
            {
                hwDevInfos[numDeviceNames - 1].hasPlayback = 1;
                hwDevInfos[numDeviceNames - 1].hasCapture  = 1;
            }
        }
    }
    else
        PA_DEBUG(( "%s: Iterating over ALSA plugins failed: %s\n", __FUNCTION__, alsa_snd_strerror( res ) ));

    /* allocate deviceInfo memory based on the number of devices */
    PA_UNLESS( baseApi->deviceInfos = (PaDeviceInfo**)PaUtil_GroupAllocateMemory(
            alsaApi->allocations, sizeof(PaDeviceInfo*) * (numDeviceNames) ), paInsufficientMemory );

    /* allocate all device info structs in a contiguous block */
    PA_UNLESS( deviceInfoArray = (PaAlsaDeviceInfo*)PaUtil_GroupAllocateMemory(
            alsaApi->allocations, sizeof(PaAlsaDeviceInfo) * numDeviceNames ), paInsufficientMemory );

    /* Loop over list of cards, filling in info. If a device is deemed unavailable (can't get name),
     * it's ignored.
     *
     * Note that we do this in two stages. This is a workaround owing to the fact that the 'dmix'
     * plugin may cause the underlying hardware device to be busy for a short while even after it
     * (dmix) is closed. The 'default' plugin may also point to the dmix plugin, so the same goes
     * for this.
     */
    PA_DEBUG(( "%s: Filling device info for %d devices\n", __FUNCTION__, numDeviceNames ));
    for( i = 0, devIdx = 0; i < numDeviceNames; ++i )
    {
        PaAlsaDeviceInfo* devInfo = &deviceInfoArray[i];
        HwDevInfo* hwInfo = &hwDevInfos[i];
        if( !strcmp( hwInfo->name, "dmix" ) || !strcmp( hwInfo->name, "default" ) )
        {
            continue;
        }

        PA_ENSURE( FillInDevInfo( alsaApi, hwInfo, blocking, devInfo, &devIdx ) );
    }
    assert( devIdx <= numDeviceNames );
    /* Now inspect 'dmix' and 'default' plugins */
    for( i = 0; i < numDeviceNames; ++i )
    {
        PaAlsaDeviceInfo* devInfo = &deviceInfoArray[i];
        HwDevInfo* hwInfo = &hwDevInfos[i];
        if( strcmp( hwInfo->name, "dmix" ) && strcmp( hwInfo->name, "default" ) )
        {
            continue;
        }

        PA_ENSURE( FillInDevInfo( alsaApi, hwInfo, blocking, devInfo, &devIdx ) );
    }
    free( hwDevInfos );

    baseApi->info.deviceCount = devIdx;   /* Number of successfully queried devices */

#ifdef PA_ENABLE_DEBUG_OUTPUT
    PA_DEBUG(( "%s: Building device list took %f seconds\n", __FUNCTION__, PaUtil_GetTime() - startTime ));
#endif

end:
    return result;

error:
    /* No particular action */
    goto end;
}